

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O0

int run_test_loop_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  
  puVar2 = uv_default_loop();
  uv_prepare_init(puVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  puVar2 = uv_default_loop();
  uv_timer_init(puVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x3a,"r");
    abort();
  }
  if ((long)timer_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x3b,"1","==","timer_called",1,"==",(long)timer_called);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x3e,"r");
    abort();
  }
  if ((long)prepare_called < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x3f,"prepare_called",">","1",(long)prepare_called,">",1);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x42,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)timer_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x43,"10","==","timer_called",10,"==",(long)timer_called);
    abort();
  }
  if ((long)prepare_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x44,"10","==","prepare_called",10,"==",(long)prepare_called);
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-stop.c"
            ,0x46,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r);
  ASSERT_EQ(1, timer_called);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r);
  ASSERT_GT(prepare_called, 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(10, timer_called);
  ASSERT_EQ(10, prepare_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}